

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

void __thiscall
ThreadPool::add(ThreadPool *this,function<void_()> *task,function<void_()> *callback)

{
  pointer ppTVar1;
  ThreadTask *this_00;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  int iVar5;
  int i;
  ulong uVar6;
  function<void_()> local_70;
  function<void_()> local_50;
  
  iVar5 = 0;
  uVar6 = 1;
  while( true ) {
    ppTVar1 = (this->_workers).super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_workers).
                      super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar6) break;
    sVar3 = std::deque<Task,_std::allocator<Task>_>::size(&(ppTVar1[uVar6]->_taskQueue).c);
    sVar4 = std::deque<Task,_std::allocator<Task>_>::size
                      (&((this->_workers).
                         super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar5]->_taskQueue).c);
    iVar2 = (int)uVar6;
    if ((int)sVar4 <= (int)sVar3) {
      iVar2 = iVar5;
    }
    iVar5 = iVar2;
    uVar6 = uVar6 + 1;
  }
  this_00 = ppTVar1[iVar5];
  std::function<void_()>::function(&local_50,task);
  std::function<void_()>::function(&local_70,callback);
  ThreadTask::add(this_00,&local_50,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return;
}

Assistant:

void add(std::function<void()> task, std::function<void()> callback = nullptr)
	{
		int index = 0;
		for (int i = 1; i < _workers.size(); ++i)
		{
			if (_workers[i]->getSize() < _workers[index]->getSize())
				index = i;
		}
		_workers[index]->add(task, callback);
	}